

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cbor_parser.hpp
# Opt level: O2

void __thiscall
jsoncons::cbor::basic_cbor_parser<jsoncons::stream_source<unsigned_char>,_std::allocator<char>_>::
produce_begin_multi_dim
          (basic_cbor_parser<jsoncons::stream_source<unsigned_char>,_std::allocator<char>_> *this,
          item_event_visitor *visitor,semantic_tag tag,error_code *ec)

{
  ssize_t sVar1;
  assertion_error *this_00;
  uint8_t b;
  allocator<char> local_4c [4];
  string local_48;
  
  sVar1 = stream_source<unsigned_char>::read(&this->source_,(int)&b,(void *)0x1,(size_t)ec);
  if (sVar1 != 0) {
    this_00 = (assertion_error *)__cxa_allocate_exception(0x10);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_48,
               "assertion \'major_type == jsoncons::cbor::detail::cbor_major_type::array\' failed at  <> :0"
               ,local_4c);
    assertion_error::assertion_error(this_00,&local_48);
    __cxa_throw(this_00,&assertion_error::typeinfo,std::runtime_error::~runtime_error);
  }
  std::error_code::operator=(ec,unexpected_eof);
  this->more_ = false;
  return;
}

Assistant:

void produce_begin_multi_dim(item_event_visitor& visitor, 
                                 semantic_tag tag,
                                 std::error_code& ec)
    {
        uint8_t b;
        if (source_.read(&b, 1) == 0)
        {
            ec = cbor_errc::unexpected_eof;
            more_ = false;
            return;
        }
        jsoncons::cbor::detail::cbor_major_type major_type = get_major_type(b);
        JSONCONS_ASSERT(major_type == jsoncons::cbor::detail::cbor_major_type::array);
        uint8_t info = get_additional_information_value(b);
       
        read_shape(info, ec);   
        if (JSONCONS_UNLIKELY(ec))
        {
            return;
        }

        state_stack_.emplace_back(parse_mode::multi_dim, 0);
        visitor.begin_multi_dim(shape_, tag, *this, ec);
        more_ = !cursor_mode_;
    }